

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O0

void __thiscall Assimp::LWO::Shader::Shader(Shader *this)

{
  allocator<char> local_25 [20];
  allocator<char> local_11;
  Shader *local_10;
  Shader *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->functionName,"unknown",local_25);
  std::allocator<char>::~allocator(local_25);
  this->enabled = true;
  return;
}

Assistant:

Shader()
        :   ordinal         ("\x00")
        ,   functionName    ("unknown")
        ,   enabled         (true)
    {}